

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_save_simple_key_mark
              (fy_parser *fyp,fy_simple_key_mark *fyskm,fy_token_type next_type,fy_mark *end_markp)

{
  int iVar1;
  fy_token *fyt;
  fy_mark local_18;
  
  if (end_markp == (fy_mark *)0x0) {
    if (fyp == (fy_parser *)0x0) {
      end_markp = &local_18;
      local_18.input_pos = 0;
      local_18.line = 0;
      local_18.column = 0;
    }
    else {
      local_18.input_pos = fyp->current_input_pos;
      end_markp = &local_18;
      local_18.line = fyp->line;
      local_18.column = fyp->column;
    }
  }
  if ((fyp->queued_tokens)._lh.next == &(fyp->queued_tokens)._lh) {
    fyt = (fy_token *)0x0;
  }
  else {
    fyt = (fy_token *)(fyp->queued_tokens)._lh.prev;
  }
  iVar1 = fy_save_simple_key(fyp,&fyskm->mark,end_markp,fyt,fyskm->required,fyskm->flow_level,
                             next_type);
  return iVar1;
}

Assistant:

int fy_save_simple_key_mark(struct fy_parser *fyp,
                            struct fy_simple_key_mark *fyskm,
                            enum fy_token_type next_type,
                            struct fy_mark *end_markp) {
    struct fy_mark end_mark;

    if (!end_markp) {
        fy_get_mark(fyp, &end_mark);
        end_markp = &end_mark;
    }

    return fy_save_simple_key(fyp, &fyskm->mark, end_markp,
                              fy_token_list_last(&fyp->queued_tokens),
                              fyskm->required, fyskm->flow_level,
                              next_type);
}